

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O3

CURLcode Curl_cf_http_proxy_insert_after(Curl_cfilter *cf_at,Curl_easy *data)

{
  CURLcode CVar1;
  void *ctx;
  Curl_cfilter *cf;
  Curl_cfilter *local_20;
  
  ctx = (*Curl_ccalloc)(1,8);
  if (ctx == (void *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
    ctx = (void *)0x0;
  }
  else {
    CVar1 = Curl_cf_create(&local_20,&Curl_cft_http_proxy,ctx);
    if (CVar1 == CURLE_OK) {
      Curl_conn_cf_insert_after(cf_at,local_20);
      ctx = (void *)0x0;
      CVar1 = CURLE_OK;
    }
  }
  (*Curl_cfree)(ctx);
  return CVar1;
}

Assistant:

CURLcode Curl_cf_http_proxy_insert_after(struct Curl_cfilter *cf_at,
                                         struct Curl_easy *data)
{
  struct Curl_cfilter *cf;
  struct cf_proxy_ctx *ctx = NULL;
  CURLcode result;

  (void)data;
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }
  result = Curl_cf_create(&cf, &Curl_cft_http_proxy, ctx);
  if(result)
    goto out;
  ctx = NULL;
  Curl_conn_cf_insert_after(cf_at, cf);

out:
  free(ctx);
  return result;
}